

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

bool __thiscall deqp::gls::MemObjectAllocator::allocUntilFailure(MemObjectAllocator *this)

{
  bool bVar1;
  GLenum GVar2;
  deUint64 dVar3;
  deUint64 dVar4;
  bad_alloc *anon_var_0;
  deUint64 currentTimeUs;
  deUint64 beginTimeUs;
  deUint64 timeoutUs;
  undefined1 local_28 [8];
  Random rnd;
  MemObjectAllocator *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_28,this->m_seed);
  GVar2 = glwGetError();
  glu::checkError(GVar2,"Error in init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                  ,0x1f1);
  dVar3 = deGetMicroseconds();
  while( true ) {
    GVar2 = glwGetError();
    glu::checkError(GVar2,"Unkown Error",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x1fa);
    if (this->m_objectTypes == MEMOBJECTTYPE_TEXTURE) {
      allocateTexture(this,(Random *)local_28);
    }
    else if (this->m_objectTypes == MEMOBJECTTYPE_BUFFER) {
      allocateBuffer(this,(Random *)local_28);
    }
    else {
      bVar1 = de::Random::getBool((Random *)local_28);
      if (bVar1) {
        allocateBuffer(this,(Random *)local_28);
      }
      else {
        allocateTexture(this,(Random *)local_28);
      }
    }
    if (this->m_result != RESULT_LAST) break;
    dVar4 = deGetMicroseconds();
    if (9999999 < dVar4 - dVar3) {
      if (dVar4 - dVar3 < 10000000) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
LAB_00f03918:
      de::Random::~Random((Random *)local_28);
      return this_local._7_1_;
    }
  }
  glwFinish();
  this_local._7_1_ = true;
  goto LAB_00f03918;
}

Assistant:

bool MemObjectAllocator::allocUntilFailure (void)
{
	de::Random rnd(m_seed);
	GLU_CHECK_MSG("Error in init");
	try
	{
		const deUint64	timeoutUs	= 10000000; // 10s
		deUint64		beginTimeUs	= deGetMicroseconds();
		deUint64		currentTimeUs;

		do
		{
			GLU_CHECK_MSG("Unkown Error");
			switch (m_objectTypes)
			{
				case MEMOBJECTTYPE_TEXTURE:
					allocateTexture(rnd);
					break;

				case MEMOBJECTTYPE_BUFFER:
					allocateBuffer(rnd);
					break;

				default:
				{
					if (rnd.getBool())
						allocateBuffer(rnd);
					else
						allocateTexture(rnd);
					break;
				}
			}

			if (m_result != RESULT_LAST)
			{
				glFinish();
				return true;
			}

			currentTimeUs = deGetMicroseconds();
		} while (currentTimeUs - beginTimeUs < timeoutUs);

		// Timeout
		if (currentTimeUs - beginTimeUs >= timeoutUs)
			return false;
		else
			return true;
	}
	catch (const std::bad_alloc&)
	{
		m_result = RESULT_GOT_BAD_ALLOC;
		return true;
	}
}